

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddDependenciesCommand.h
# Opt level: O0

cmCommand * __thiscall cmAddDependenciesCommand::Clone(cmAddDependenciesCommand *this)

{
  cmCommand *this_00;
  cmAddDependenciesCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmAddDependenciesCommand((cmAddDependenciesCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmAddDependenciesCommand; }